

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

bool __thiscall node::BlockManager::FlushUndoFile(BlockManager *this,int block_file,bool finalize)

{
  Notifications *pNVar1;
  bool bVar2;
  long in_FS_OFFSET;
  FlatFilePos undo_pos_old;
  FlatFilePos local_68;
  bilingual_str local_60;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.nPos =
       (this->m_blockfile_info).super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>.
       _M_impl.super__Vector_impl_data._M_start[block_file].nUndoSize;
  local_68.nFile = block_file;
  bVar2 = FlatFileSeq::Flush(&this->m_undo_file_seq,&local_68,finalize);
  if (!bVar2) {
    pNVar1 = (this->m_opts).notifications;
    _(&local_60,(ConstevalStringLiteral)0xc9dda4);
    (*pNVar1->_vptr_Notifications[7])(pNVar1,&local_60);
    bilingual_str::~bilingual_str(&local_60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::FlushUndoFile(int block_file, bool finalize)
{
    FlatFilePos undo_pos_old(block_file, m_blockfile_info[block_file].nUndoSize);
    if (!m_undo_file_seq.Flush(undo_pos_old, finalize)) {
        m_opts.notifications.flushError(_("Flushing undo file to disk failed. This is likely the result of an I/O error."));
        return false;
    }
    return true;
}